

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

void jsonnet::internal::remove_initial_newlines(AST *ast)

{
  AST *pAVar1;
  iterator __position;
  
  pAVar1 = left_recursive_deep(ast);
  __position._M_current =
       (pAVar1->openFodder).
       super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if ((pAVar1->openFodder).
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != __position._M_current) {
    do {
      if ((__position._M_current)->kind != LINE_END) {
        return;
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      _M_erase(&pAVar1->openFodder,__position);
      __position._M_current =
           (pAVar1->openFodder).
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
    } while ((pAVar1->openFodder).
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish != __position._M_current);
  }
  return;
}

Assistant:

static Fodder &open_fodder(AST *ast_)
{
    return left_recursive_deep(ast_)->openFodder;
}